

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::drawTestCompute
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this,GLint program
          ,int binding)

{
  int iVar1;
  deBool dVar2;
  undefined4 extraout_var;
  RenderContext *pRVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Vector<float,_4> *v;
  bool bVar4;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar6;
  undefined8 uVar5;
  String local_158;
  RGBA local_134;
  RGBA local_130;
  allocator<char> local_129;
  String local_128;
  String local_108;
  undefined4 local_e8;
  undefined4 local_e4;
  deUint32 expected_1;
  deUint32 tex;
  deUint32 something;
  Vector<float,_4> local_cc [2];
  allocator<char> local_a9;
  String local_a8;
  String local_88;
  undefined1 local_68 [8];
  Vec4 expected;
  Vec4 pixel;
  GLfloat buffer [4];
  undefined4 local_30;
  bool local_29;
  deUint32 fb_or_ssb;
  bool passed;
  Functions *l_gl;
  int binding_local;
  GLint program_local;
  LayoutBindingBaseCase *this_local;
  
  l_gl._0_4_ = binding;
  l_gl._4_4_ = program;
  _binding_local = this;
  this_local = (LayoutBindingBaseCase *)__return_storage_ptr__;
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
  pRVar3 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _fb_or_ssb = CONCAT44(extraout_var_00,iVar1);
  local_29 = true;
  do {
    dVar2 = ::deGetFalse();
    bVar4 = false;
    if (dVar2 == 0) {
      iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])();
      bVar4 = iVar1 == 2;
    }
    if (!bVar4) {
      deAssertFail("getStage() == ComputeShader",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cLayoutBindingTests.cpp"
                   ,0x48c);
    }
    dVar2 = ::deGetFalse();
    uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  } while (dVar2 != 0);
  (**(code **)(_fb_or_ssb + 0x1680))(l_gl._4_4_);
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  if (*(int *)(CONCAT44(extraout_var_01,iVar1) + 8) == 2) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
              (this,(ulong)(uint)l_gl);
    pixel.m_data[2] = 0.1;
    pixel.m_data[3] = 0.2;
    (**(code **)(_fb_or_ssb + 0x6c8))(1,&local_30);
    (**(code **)(_fb_or_ssb + 0x40))(0x90d2,local_30);
    (**(code **)(_fb_or_ssb + 0x150))(0x90d2,0x10,pixel.m_data + 2,0x88ea);
    (**(code **)(_fb_or_ssb + 0x48))(0x90d2,0,local_30);
    (**(code **)(_fb_or_ssb + 0x528))(1,1);
    (**(code **)(_fb_or_ssb + 0xdb8))(0x200);
    v = (Vector<float,_4> *)(**(code **)(_fb_or_ssb + 0xd00))(0x90d2,0,0x10);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(expected.m_data + 2),v);
    (**(code **)(_fb_or_ssb + 0x1670))(0x90d2);
    (**(code **)(_fb_or_ssb + 0x40))(0x90d2,0);
    (**(code **)(_fb_or_ssb + 0x438))(1,&local_30);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
              (this,(ulong)(uint)l_gl);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_68,0.0,1.0,0.0,1.0);
    bVar4 = tcu::Vector<float,_4>::operator==
                      ((Vector<float,_4> *)(expected.m_data + 2),(Vector<float,_4> *)local_68);
    local_29 = bVar4;
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"drawTestCompute failed",&local_a9);
      tcu::Vector<float,_4>::Vector(local_cc,(Vector<float,_4> *)local_68);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&tex,(Vector<float,_4> *)(expected.m_data + 2));
      generateLog<tcu::Vector<float,4>,tcu::Vector<float,4>>
                (&local_88,this,&local_a8,local_cc,(Vector<float,_4> *)&tex);
      LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,bVar4,&local_88,false)
      ;
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      return __return_storage_ptr__;
    }
  }
  else {
    expected_1 = 0x1020304;
    (**(code **)(_fb_or_ssb + 0x6f8))(1,&local_e4);
    (**(code **)(_fb_or_ssb + 0xb8))(0xde1,local_e4);
    (**(code **)(_fb_or_ssb + 0x1360))(0xde1,0x2801,0x2601);
    (**(code **)(_fb_or_ssb + 0x1380))(0xde1,1,0x8058,1);
    uVar5 = CONCAT44(uVar6,0x1908);
    (**(code **)(_fb_or_ssb + 0x13b8))(0xde1,0,0,0,1,1,uVar5,0x1401,&expected_1);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
              (this,(ulong)(uint)l_gl);
    uVar5 = CONCAT44(uVar6,0x8058);
    (**(code **)(_fb_or_ssb + 0x80))(0,local_e4,0,0,0,0x88b9,uVar5);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    (**(code **)(_fb_or_ssb + 0x528))(1,1);
    (**(code **)(_fb_or_ssb + 0xdb8))(0x400);
    (**(code **)(_fb_or_ssb + 0x80))(0,0,0,0,0,0x88b9,CONCAT44(uVar6,0x8058));
    (**(code **)(_fb_or_ssb + 0x6d0))(1,&local_30);
    (**(code **)(_fb_or_ssb + 0x78))(0x8d40,local_30);
    (**(code **)(_fb_or_ssb + 0x6a0))(0x8d40,0x8ce0,0xde1,local_e4,0);
    (**(code **)(_fb_or_ssb + 0x1220))(0,0,1,1,0x1908,0x1401,&expected_1);
    (**(code **)(_fb_or_ssb + 0x78))(0x8d40,0);
    (**(code **)(_fb_or_ssb + 0x440))(1,&local_30);
    (**(code **)(_fb_or_ssb + 0x480))(1,&local_e4);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
              (this,(ulong)(uint)l_gl);
    local_e8 = 0xff00ff00;
    bVar4 = expected_1 == 0xff00ff00;
    local_29 = bVar4;
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"drawTestCompute failed",&local_129);
      tcu::RGBA::RGBA(&local_130,0xff00ff00);
      tcu::RGBA::RGBA(&local_134,expected_1);
      generateLog<tcu::RGBA,tcu::RGBA>(&local_108,this,&local_128,local_130,local_134);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar4,&local_108,false);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      return __return_storage_ptr__;
    }
  }
  bVar4 = local_29;
  std::__cxx11::string::string((string *)&local_158);
  LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,bVar4,&local_158,false);
  std::__cxx11::string::~string((string *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::drawTestCompute(glw::GLint program, int binding)
{
	const glw::Functions& l_gl   = getContext().getRenderContext().getFunctions();
	bool				  passed = true;

	DE_TEST_ASSERT(getStage() == ComputeShader);

	l_gl.useProgram(program);

	deUint32 fb_or_ssb;

	if (getTestParameters().surface_type == Image)
	{
		bind(binding);

		glw::GLfloat buffer[4] = { 0.1f, 0.2f, 0.3f, 0.4f };
		l_gl.genBuffers(1, &fb_or_ssb);
		l_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, fb_or_ssb);

		l_gl.bufferData(GL_SHADER_STORAGE_BUFFER, 4 * sizeof(glw::GLfloat), buffer, GL_DYNAMIC_COPY);

		l_gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, fb_or_ssb);

		l_gl.dispatchCompute(1, 1, 1);
		l_gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		tcu::Vec4 pixel =
			*(tcu::Vec4*)l_gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
		l_gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

		l_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		l_gl.deleteBuffers(1, &fb_or_ssb);

		unbind(binding);

		tcu::Vec4 expected(0.0f, 1.0f, 0.0f, 1.0f);
		passed = (pixel == expected);
		if (!passed)
		{
			return LayoutBindingTestResult(passed, generateLog(String("drawTestCompute failed"), expected, pixel));
		}
	}
	else
	{
		deUint32 something = 0x01020304, tex;

		l_gl.genTextures(1, &tex);
		l_gl.bindTexture(GL_TEXTURE_2D, tex);
		l_gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		l_gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
		l_gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &something);

		bind(binding);

		l_gl.bindImageTexture(0, tex, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);

		l_gl.dispatchCompute(1, 1, 1);
		l_gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);

		l_gl.bindImageTexture(0, 0, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);

		l_gl.genFramebuffers(1, &fb_or_ssb);
		l_gl.bindFramebuffer(GL_FRAMEBUFFER, fb_or_ssb);
		l_gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);

		l_gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &something);

		l_gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		l_gl.deleteFramebuffers(1, &fb_or_ssb);
		l_gl.deleteTextures(1, &tex);

		unbind(binding);

		const deUint32 expected = 0xff00ff00;
		passed					= (expected == something);
		if (!passed)
		{
			return LayoutBindingTestResult(
				passed, generateLog(String("drawTestCompute failed"), tcu::RGBA(expected), tcu::RGBA(something)));
		}
	}

	return passed;
}